

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O2

float Gia_IffObjTimeTwo(Iff_Man_t *p,int iObj,int *piFanin,float DelayMin)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  long lVar5;
  float fVar6;
  
  *piFanin = -1;
  lVar5 = 0;
  do {
    iVar1 = Gia_ObjLutSize(p->pGia,iObj);
    if (iVar1 <= lVar5) {
      return DelayMin;
    }
    piVar3 = Gia_ObjLutFanins(p->pGia,iObj);
    iVar1 = piVar3[lVar5];
    pGVar4 = Gia_ManObj(p->pGia,iVar1);
    if ((~*(uint *)pGVar4 & 0x9fffffff) != 0) {
      fVar6 = Gia_IffObjTimeOne(p,iObj,iVar1,-1);
      iVar2 = Gia_IffObjCount(p->pGia,iObj,iVar1,-1);
      if (p->pLib->LutMax < iVar2) {
        __assert_fail("nSize <= p->pLib->LutMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIff.c"
                      ,0xb0,"float Gia_IffObjTimeTwo(Iff_Man_t *, int, int *, float)");
      }
      fVar6 = fVar6 + p->pLib->pLutDelays[iVar2][0];
      if (fVar6 < DelayMin) {
        *piFanin = iVar1;
        DelayMin = fVar6;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

float Gia_IffObjTimeTwo( Iff_Man_t * p, int iObj, int * piFanin, float DelayMin )
{
    int i, iFanin, nSize;
    float This;
    *piFanin = -1;
    Gia_LutForEachFanin( p->pGia, iObj, iFanin, i )
    {
        if ( Gia_ObjIsCi(Gia_ManObj(p->pGia, iFanin)) )
            continue;
        This = Gia_IffObjTimeOne( p, iObj, iFanin, -1 );
        nSize = Gia_IffObjCount( p->pGia, iObj, iFanin, -1 );
        assert( nSize <= p->pLib->LutMax );
        This += p->pLib->pLutDelays[nSize][0];
        if ( DelayMin > This )
        {
            DelayMin = This;
            *piFanin = iFanin;
        }
    }
    return DelayMin;
}